

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O3

_Bool xdr_nreplymsg(XDR *xdrs,rpc_msg *rmsg)

{
  uint *puVar1;
  msg_type *pmVar2;
  reply_body *prVar3;
  xdr_discrim *pxVar4;
  xdr_op xVar5;
  uint uVar6;
  _Bool _Var7;
  msg_type mVar8;
  reply_stat rVar9;
  code *UNRECOVERED_JUMPTABLE;
  xdrproc_t *pp_Var10;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x90,"_Bool xdr_nreplymsg(XDR *, struct rpc_msg *)");
  }
  if (rmsg == (rpc_msg *)0x0) {
    __assert_fail("rmsg != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x91,"_Bool xdr_nreplymsg(XDR *, struct rpc_msg *)");
  }
  xVar5 = xdrs->x_op;
  if (xVar5 == XDR_ENCODE) {
    uVar6 = rmsg->rm_xid;
    puVar1 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_wrap < puVar1) {
      _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,uVar6);
LAB_0011104a:
      if (_Var7 == false) {
        return false;
      }
    }
    else {
      *(uint *)xdrs->x_data =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      xdrs->x_data = (uint8_t *)puVar1;
    }
LAB_00111067:
    xVar5 = xdrs->x_op;
    pmVar2 = &rmsg->rm_direction;
    if (xVar5 == XDR_FREE) goto LAB_001110d1;
    if (xVar5 != XDR_DECODE) {
      if (xVar5 != XDR_ENCODE) {
        return false;
      }
      mVar8 = *pmVar2;
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar1) {
        _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,mVar8);
        goto LAB_001110b6;
      }
      *(msg_type *)xdrs->x_data =
           mVar8 >> 0x18 | (mVar8 & 0xff0000) >> 8 | (mVar8 & 0xff00) << 8 | mVar8 << 0x18;
      xdrs->x_data = (uint8_t *)puVar1;
      goto LAB_001110d1;
    }
    puVar1 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar1) {
      _Var7 = (*xdrs->x_ops->x_getunit)(xdrs,pmVar2);
LAB_001110b6:
      if (_Var7 == false) {
        return false;
      }
      goto LAB_001110d1;
    }
    uVar6 = *(uint *)xdrs->x_data;
    mVar8 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    *pmVar2 = mVar8;
    xdrs->x_data = (uint8_t *)puVar1;
  }
  else {
    if (xVar5 == XDR_DECODE) {
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar1) {
        _Var7 = (*xdrs->x_ops->x_getunit)(xdrs,&rmsg->rm_xid);
        goto LAB_0011104a;
      }
      uVar6 = *(uint *)xdrs->x_data;
      rmsg->rm_xid = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18
      ;
      xdrs->x_data = (uint8_t *)puVar1;
      goto LAB_00111067;
    }
    if (xVar5 != XDR_FREE) {
      return false;
    }
LAB_001110d1:
    mVar8 = rmsg->rm_direction;
  }
  if (mVar8 != REPLY) {
    return false;
  }
  prVar3 = &(rmsg->ru).RM_rmb;
  xVar5 = xdrs->x_op;
  if (xVar5 != XDR_FREE) {
    if (xVar5 == XDR_DECODE) {
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if (puVar1 <= (xdrs->x_v).vio_tail) {
        uVar6 = *(uint *)xdrs->x_data;
        rVar9 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        prVar3->rp_stat = rVar9;
        xdrs->x_data = (uint8_t *)puVar1;
        goto LAB_00111148;
      }
      _Var7 = (*xdrs->x_ops->x_getunit)(xdrs,&prVar3->rp_stat);
    }
    else {
      if (xVar5 != XDR_ENCODE) {
        return false;
      }
      rVar9 = prVar3->rp_stat;
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if (puVar1 <= (xdrs->x_v).vio_wrap) {
        *(reply_stat *)xdrs->x_data =
             rVar9 >> 0x18 | (rVar9 & 0xff0000) >> 8 | (rVar9 & 0xff00) << 8 | rVar9 << 0x18;
        xdrs->x_data = (uint8_t *)puVar1;
        goto LAB_00111145;
      }
      _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,rVar9);
    }
    if (_Var7 == false) {
      return false;
    }
  }
LAB_00111145:
  rVar9 = prVar3->rp_stat;
LAB_00111148:
  if (rVar9 == MSG_ACCEPTED) {
    UNRECOVERED_JUMPTABLE = xdr_naccepted_reply;
  }
  else {
    pp_Var10 = &reply_dscrm[1].proc;
    do {
      UNRECOVERED_JUMPTABLE = *pp_Var10;
      if (UNRECOVERED_JUMPTABLE == (xdrproc_t)0x0) {
        return false;
      }
      pxVar4 = (xdr_discrim *)(pp_Var10 + -1);
      pp_Var10 = pp_Var10 + 2;
    } while (pxVar4->value != rVar9);
  }
  _Var7 = (*UNRECOVERED_JUMPTABLE)(xdrs,&(rmsg->ru).RM_rmb.ru);
  return _Var7;
}

Assistant:

bool
xdr_nreplymsg(XDR *xdrs, struct rpc_msg *rmsg)
{
	assert(xdrs != NULL);
	assert(rmsg != NULL);

	if (inline_xdr_u_int32_t(xdrs, &(rmsg->rm_xid))
	    && inline_xdr_enum(xdrs, (enum_t *) &(rmsg->rm_direction))
	    && (rmsg->rm_direction == REPLY))
		return (inline_xdr_union(xdrs,
					 (enum_t *)&(rmsg->rm_reply.rp_stat),
					 (void *)&(rmsg->rm_reply.ru),
					 reply_dscrm, NULL_xdrproc_t));
	return (false);
}